

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

int Sfm_DecMffcArea(Abc_Ntk_t *pNtk,Vec_Int_t *vMffc)

{
  int i;
  Abc_Obj_t *pAVar1;
  int i_00;
  int iVar2;
  double dVar3;
  
  iVar2 = 0;
  for (i_00 = 0; i_00 < vMffc->nSize; i_00 = i_00 + 1) {
    i = Vec_IntEntry(vMffc,i_00);
    pAVar1 = Abc_NtkObj(pNtk,i);
    if (pAVar1 != (Abc_Obj_t *)0x0) {
      dVar3 = Mio_GateReadArea((Mio_Gate_t *)(pAVar1->field_5).pData);
      iVar2 = iVar2 + (int)((float)dVar3 * 1000.0);
    }
  }
  return iVar2;
}

Assistant:

int Sfm_DecMffcArea( Abc_Ntk_t * pNtk, Vec_Int_t * vMffc )
{
    Abc_Obj_t * pObj; 
    int i, nAreaMffc = 0;
    Abc_NtkForEachObjVec( vMffc, pNtk, pObj, i )
        nAreaMffc += Scl_Flt2Int(Mio_GateReadArea((Mio_Gate_t *)pObj->pData));
    return nAreaMffc;
}